

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AviWriter.cpp
# Opt level: O3

void __thiscall AviWriter::useFrame(AviWriter *this,avi_frame_t *frame)

{
  iterator *piVar1;
  int64_t iVar2;
  _Elt_pointer ppAVar3;
  int64_t *piVar4;
  uint uVar5;
  uint *puVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  AVIIndexRecord *indexRecord;
  AVIIndexRecord *local_28;
  
  iVar2 = frame->pts;
  iVar8 = (int)iVar2;
  if (frame->type == 'A') {
    piVar4 = &this->fPrevAudioPts;
    uVar7 = 0x62773130;
    if ((this->fPrevAudioPts != 0) &&
       (uVar5 = (uint)(long)(((double)frame->size * 1000000.0) /
                            (double)(iVar8 - (int)this->fPrevAudioPts)),
       this->fAudioMaxBytesPerSecond < uVar5)) {
      this->fAudioMaxBytesPerSecond = uVar5;
    }
    lVar9 = 0;
  }
  else {
    piVar4 = &this->fPrevVideoPts;
    uVar7 = 0x63643030;
    lVar9 = 4;
    if ((this->fPrevVideoPts != 0) &&
       (uVar5 = (uint)(long)(((double)frame->size * 1000000.0) /
                            (double)(iVar8 - (int)this->fPrevVideoPts)),
       this->fVideoMaxBytesPerSecond < uVar5)) {
      this->fVideoMaxBytesPerSecond = uVar5;
    }
  }
  *piVar4 = iVar2;
  local_28 = (AVIIndexRecord *)operator_new(0x10);
  local_28->fChunkId = uVar7;
  local_28->fFlags = (uint)(frame->data[lVar9] == 'g') << 4;
  local_28->fOffset = this->fNumBytesWritten + 4;
  local_28->fSize = frame->size;
  ppAVar3 = (this->indexRecords).c.
            super__Deque_base<AVIIndexRecord_*,_std::allocator<AVIIndexRecord_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  if (ppAVar3 ==
      (this->indexRecords).c.super__Deque_base<AVIIndexRecord_*,_std::allocator<AVIIndexRecord_*>_>.
      _M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<AVIIndexRecord*,std::allocator<AVIIndexRecord*>>::
    _M_push_back_aux<AVIIndexRecord*const&>
              ((deque<AVIIndexRecord*,std::allocator<AVIIndexRecord*>> *)&this->indexRecords,
               &local_28);
  }
  else {
    *ppAVar3 = local_28;
    piVar1 = &(this->indexRecords).c.
              super__Deque_base<AVIIndexRecord_*,_std::allocator<AVIIndexRecord_*>_>._M_impl.
              super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  addWord(this,uVar7);
  this->fNumBytesWritten = this->fNumBytesWritten + 4;
  addWord(this,frame->size);
  this->fNumBytesWritten = this->fNumBytesWritten + 4;
  fwrite(frame->data,1,(long)frame->size,(FILE *)this->fOutFid);
  uVar7 = frame->size;
  this->fNumBytesWritten = this->fNumBytesWritten + uVar7;
  if ((uVar7 & 1) == 0) {
    putc(0,(FILE *)this->fOutFid);
    this->fNumBytesWritten = this->fNumBytesWritten + 1;
  }
  puVar6 = &this->fNumAudioFrames;
  if (frame->type != 'A') {
    puVar6 = &this->fNumVideoFrames;
  }
  *puVar6 = *puVar6 + 1;
  return;
}

Assistant:

void AviWriter::useFrame(const avi_frame_t &frame)
{
    if (frame.type == AVI_AUDIO_FRAME) {
        if (fPrevAudioPts) {
            int uSecondsDiff = frame.pts - fPrevAudioPts;
            unsigned bytePerSeconds = frame.size * 1000000.0 / uSecondsDiff;
            if (bytePerSeconds > fAudioMaxBytesPerSecond)
                fAudioMaxBytesPerSecond = bytePerSeconds;
        }

        fPrevAudioPts = frame.pts;
    } else {
        if (fPrevVideoPts) {
            int uSecondsDiff = frame.pts - fPrevVideoPts;
            unsigned bytePerSeconds = frame.size * 1000000.0 / uSecondsDiff;
            if (bytePerSeconds > fVideoMaxBytesPerSecond)
                fVideoMaxBytesPerSecond = bytePerSeconds;
        }

        fPrevVideoPts = frame.pts;
    }

    unsigned subsessionTag = (frame.type == AVI_AUDIO_FRAME ? fourChar('0', '1', 'w', 'b') : fourChar('0', '0', 'd', 'c'));

    auto indexRecord = new AVIIndexRecord;

    indexRecord->fChunkId = subsessionTag;
    int testIndex = (frame.type == AVI_AUDIO_FRAME ? 0 : 4);
    indexRecord->fFlags = frame.data[testIndex] == 0x67 ? 0x10 : 0;
    indexRecord->fOffset = 4 + fNumBytesWritten; // riff chunk header offset from movi chunk start (4 = movi)
    indexRecord->fSize = frame.size; // chunk size excluding riff header size (only frame data)

    indexRecords.push(indexRecord);

    fNumBytesWritten += addWord(subsessionTag);
    fNumBytesWritten += addWord(frame.size);

    fwrite(frame.data, 1, frame.size, fOutFid);
    fNumBytesWritten += frame.size;

    // Pad to an even length:

    if (frame.size % 2 == 0)
        fNumBytesWritten += addByte(0);

    (frame.type == AVI_AUDIO_FRAME ? fNumAudioFrames : fNumVideoFrames)++;
}